

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_SubStreamsInfo(archive_read *a,_7z_substream_info *ss,_7z_folder *f,size_t numFolders)

{
  int iVar1;
  byte *pbVar2;
  uint64_t *puVar3;
  uchar *puVar4;
  uint32_t *puVar5;
  uint local_90;
  int local_8c;
  uint j;
  int di;
  uint32_t *digests;
  uchar *digestsDefined;
  _7z_digests tmpDigests;
  uint64_t sum;
  uint64_t size;
  uint pack;
  uint32_t numDigests;
  uint i;
  int type;
  size_t unpack_streams;
  uint64_t *usizes;
  uchar *p;
  size_t numFolders_local;
  _7z_folder *f_local;
  _7z_substream_info *ss_local;
  archive_read *a_local;
  
  memset(ss,0,0x20);
  for (pack = 0; pack < numFolders; pack = pack + 1) {
    f[pack].numUnpackStreams = 1;
  }
  pbVar2 = header_bytes(a,1);
  if (pbVar2 == (byte *)0x0) {
    return -1;
  }
  numDigests = (uint32_t)*pbVar2;
  _i = numFolders;
  if (numDigests == 0xd) {
    _i = 0;
    for (pack = 0; pack < numFolders; pack = pack + 1) {
      iVar1 = parse_7zip_uint64(a,&f[pack].numUnpackStreams);
      if (iVar1 < 0) {
        return -1;
      }
      if (100000000 < f[pack].numUnpackStreams) {
        return -1;
      }
      if (0xfffffffffa0a1eff < _i) {
        return -1;
      }
      _i = f[pack].numUnpackStreams + _i;
    }
    pbVar2 = header_bytes(a,1);
    if (pbVar2 == (byte *)0x0) {
      return -1;
    }
    numDigests = (uint32_t)*pbVar2;
  }
  ss->unpack_streams = _i;
  if (_i != 0) {
    puVar3 = (uint64_t *)calloc(_i,8);
    ss->unpackSizes = puVar3;
    puVar4 = (uchar *)calloc(_i,1);
    ss->digestsDefined = puVar4;
    puVar5 = (uint32_t *)calloc(_i,4);
    ss->digests = puVar5;
    if (((ss->unpackSizes == (uint64_t *)0x0) || (ss->digestsDefined == (uchar *)0x0)) ||
       (ss->digests == (uint32_t *)0x0)) {
      return -1;
    }
  }
  unpack_streams = (size_t)ss->unpackSizes;
  for (pack = 0; pack < numFolders; pack = pack + 1) {
    if (f[pack].numUnpackStreams != 0) {
      tmpDigests.digests = (uint32_t *)0x0;
      if (numDigests == 9) {
        for (size._0_4_ = 1; (ulong)(uint)size < f[pack].numUnpackStreams;
            size._0_4_ = (uint)size + 1) {
          iVar1 = parse_7zip_uint64(a,(uint64_t *)unpack_streams);
          if (iVar1 < 0) {
            return -1;
          }
          if (-(long)tmpDigests.digests - 1U < *(ulong *)unpack_streams) {
            return -1;
          }
          tmpDigests.digests = (uint32_t *)(*(long *)unpack_streams + (long)tmpDigests.digests);
          unpack_streams = unpack_streams + 8;
        }
      }
      puVar5 = (uint32_t *)folder_uncompressed_size(f + pack);
      if (puVar5 < tmpDigests.digests) {
        return -1;
      }
      *(long *)unpack_streams = (long)puVar5 - (long)tmpDigests.digests;
      unpack_streams = unpack_streams + 8;
    }
  }
  if (numDigests == 9) {
    pbVar2 = header_bytes(a,1);
    if (pbVar2 == (byte *)0x0) {
      return -1;
    }
    numDigests = (uint32_t)*pbVar2;
  }
  for (pack = 0; pack < _i; pack = pack + 1) {
    ss->digestsDefined[pack] = '\0';
    ss->digests[pack] = 0;
  }
  size._4_4_ = 0;
  for (pack = 0; pack < numFolders; pack = pack + 1) {
    if ((f[pack].numUnpackStreams != 1) || (f[pack].digest_defined == '\0')) {
      size._4_4_ = (int)f[pack].numUnpackStreams + size._4_4_;
    }
  }
  if (numDigests == 10) {
    digests = (uint32_t *)ss->digestsDefined;
    _j = ss->digests;
    local_8c = 0;
    memset(&digestsDefined,0,0x10);
    iVar1 = read_Digests(a,(_7z_digests *)&digestsDefined,(ulong)size._4_4_);
    if (iVar1 < 0) {
      free_Digest((_7z_digests *)&digestsDefined);
      return -1;
    }
    for (pack = 0; pack < numFolders; pack = pack + 1) {
      if ((f[pack].numUnpackStreams == 1) && (f[pack].digest_defined != '\0')) {
        *(undefined1 *)digests = 1;
        *_j = f[pack].digest;
        _j = _j + 1;
        digests = (uint32_t *)((long)digests + 1);
      }
      else {
        for (local_90 = 0; (ulong)local_90 < f[pack].numUnpackStreams; local_90 = local_90 + 1) {
          *(uchar *)digests = digestsDefined[local_8c];
          *_j = *(uint32_t *)(tmpDigests.defineds + (long)local_8c * 4);
          local_8c = local_8c + 1;
          _j = _j + 1;
          digests = (uint32_t *)((long)digests + 1);
        }
      }
    }
    free_Digest((_7z_digests *)&digestsDefined);
    pbVar2 = header_bytes(a,1);
    if (pbVar2 == (byte *)0x0) {
      return -1;
    }
    numDigests = (uint32_t)*pbVar2;
  }
  if (numDigests == 0) {
    a_local._4_4_ = 0;
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

static int
read_SubStreamsInfo(struct archive_read *a, struct _7z_substream_info *ss,
    struct _7z_folder *f, size_t numFolders)
{
	const unsigned char *p;
	uint64_t *usizes;
	size_t unpack_streams;
	int type;
	unsigned i;
	uint32_t numDigests;

	memset(ss, 0, sizeof(*ss));

	for (i = 0; i < numFolders; i++)
		f[i].numUnpackStreams = 1;

	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	type = *p;

	if (type == kNumUnPackStream) {
		unpack_streams = 0;
		for (i = 0; i < numFolders; i++) {
			if (parse_7zip_uint64(a, &(f[i].numUnpackStreams)) < 0)
				return (-1);
			if (UMAX_ENTRY < f[i].numUnpackStreams)
				return (-1);
			if (unpack_streams > SIZE_MAX - UMAX_ENTRY) {
				return (-1);
			}
			unpack_streams += (size_t)f[i].numUnpackStreams;
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		type = *p;
	} else
		unpack_streams = numFolders;

	ss->unpack_streams = unpack_streams;
	if (unpack_streams) {
		ss->unpackSizes = calloc(unpack_streams,
		    sizeof(*ss->unpackSizes));
		ss->digestsDefined = calloc(unpack_streams,
		    sizeof(*ss->digestsDefined));
		ss->digests = calloc(unpack_streams,
		    sizeof(*ss->digests));
		if (ss->unpackSizes == NULL || ss->digestsDefined == NULL ||
		    ss->digests == NULL)
			return (-1);
	}

	usizes = ss->unpackSizes;
	for (i = 0; i < numFolders; i++) {
		unsigned pack;
		uint64_t size, sum;

		if (f[i].numUnpackStreams == 0)
			continue;

		sum = 0;
		if (type == kSize) {
			for (pack = 1; pack < f[i].numUnpackStreams; pack++) {
				if (parse_7zip_uint64(a, usizes) < 0)
					return (-1);
				if (*usizes > UINT64_MAX - sum)
					return (-1);
				sum += *usizes++;
			}
		}
		size = folder_uncompressed_size(&f[i]);
		if (size < sum)
			return (-1);
		*usizes++ = size - sum;
	}

	if (type == kSize) {
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		type = *p;
	}

	for (i = 0; i < unpack_streams; i++) {
		ss->digestsDefined[i] = 0;
		ss->digests[i] = 0;
	}

	numDigests = 0;
	for (i = 0; i < numFolders; i++) {
		if (f[i].numUnpackStreams != 1 || !f[i].digest_defined)
			numDigests += (uint32_t)f[i].numUnpackStreams;
	}

	if (type == kCRC) {
		struct _7z_digests tmpDigests;
		unsigned char *digestsDefined = ss->digestsDefined;
		uint32_t * digests = ss->digests;
		int di = 0;

		memset(&tmpDigests, 0, sizeof(tmpDigests));
		if (read_Digests(a, &(tmpDigests), numDigests) < 0) {
			free_Digest(&tmpDigests);
			return (-1);
		}
		for (i = 0; i < numFolders; i++) {
			if (f[i].numUnpackStreams == 1 && f[i].digest_defined) {
				*digestsDefined++ = 1;
				*digests++ = f[i].digest;
			} else {
				unsigned j;

				for (j = 0; j < f[i].numUnpackStreams;
				    j++, di++) {
					*digestsDefined++ =
					    tmpDigests.defineds[di];
					*digests++ =
					    tmpDigests.digests[di];
				}
			}
		}
		free_Digest(&tmpDigests);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		type = *p;
	}

	/*
	 *  Must be kEnd.
	 */
	if (type != kEnd)
		return (-1);
	return (0);
}